

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiled.cpp
# Opt level: O2

void __thiscall
Rml::DecoratorTiled::Tile::GenerateGeometry
          (Tile *this,Mesh *mesh,ComputedValues *computed,Vector2f surface_origin,
          Vector2f surface_dimensions,Vector2f tile_dimensions)

{
  float fVar1;
  Vector2f VVar2;
  Type TVar3;
  TileOrientation TVar4;
  Vector2f VVar5;
  int i;
  Colour<unsigned_char,_255,_true> colour;
  long lVar6;
  float fVar7;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar8;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  undefined4 in_XMM2_Dc;
  undefined4 in_XMM2_Dd;
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  float fVar12;
  Vector2f tile_position;
  Vector2f local_98;
  Vector2<float> local_90;
  Vector2f local_88;
  Vector2f VStack_80;
  undefined1 local_78 [12];
  float fStack_6c;
  Vector2f local_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  Vector2f local_28;
  
  local_58 = surface_dimensions.y;
  local_38._8_4_ = in_XMM0_Dc;
  local_38._0_8_ = surface_origin;
  local_38._12_4_ = in_XMM0_Dd;
  if (surface_dimensions.x <= 0.0) {
    return;
  }
  if (local_58 <= 0.0) {
    return;
  }
  local_88.x = (float)(computed->rare).image_color;
  local_78._8_4_ = in_XMM2_Dc;
  local_78._0_8_ = tile_dimensions;
  fStack_6c = (float)in_XMM2_Dd;
  local_48._8_4_ = in_XMM1_Dc;
  local_48._0_8_ = surface_dimensions;
  local_48._12_4_ = in_XMM1_Dd;
  local_60 = surface_dimensions;
  fStack_54 = local_58;
  fStack_50 = local_58;
  fStack_4c = local_58;
  colour = Colour<unsigned_char,255,false>::ToPremultiplied<std::integral_constant<bool,false>,void>
                     ((Colour<unsigned_char,255,false> *)&local_88,(computed->inherited).opacity);
  if (this->tile_data_calculated != true) {
    return;
  }
  local_88.x = 0.0;
  local_88.y = 0.0;
  VStack_80.x = 0.0;
  VStack_80.y = 0.0;
  TVar4 = this->orientation;
  VVar2 = (this->tile_data).texcoords[0];
  fVar8 = VVar2.x;
  fVar7 = VVar2.y;
  VVar2 = (this->tile_data).texcoords[1];
  for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
    VVar5.y = (float)((ulong)*(undefined8 *)(oriented_texcoords + (ulong)TVar4 * 0x10 + lVar6 * 8)
                     >> 0x20) * (VVar2.y - fVar7) + fVar7;
    VVar5.x = (float)*(undefined8 *)(oriented_texcoords + (ulong)TVar4 * 0x10 + lVar6 * 8) *
              (VVar2.x - fVar8) + fVar8;
    (&local_88)[lVar6] = VVar5;
  }
  local_98.x = 0.0;
  local_98.y = 0.0;
  fVar8 = 1.0;
  fVar7 = 1.0;
  switch(this->fit_mode) {
  case FILL:
    local_98 = local_48._0_8_;
    break;
  case CONTAIN:
    auVar9 = divps(local_48,_local_78);
    fVar8 = auVar9._4_4_;
    if (auVar9._0_4_ <= auVar9._4_4_) {
      fVar8 = auVar9._0_4_;
    }
    goto LAB_00279c15;
  case COVER:
    auVar9 = divps(local_48,_local_78);
    fVar8 = auVar9._4_4_;
    if (auVar9._4_4_ <= auVar9._0_4_) {
      fVar8 = auVar9._0_4_;
    }
LAB_00279c15:
    local_98.y = fVar8 * (float)local_78._4_4_;
    local_98.x = fVar8 * (float)local_78._0_4_;
LAB_00279c1f:
    local_78._0_4_ = 1.0;
    local_78._4_4_ = 1.0;
    fStack_6c = 0.0;
    goto LAB_00279c26;
  case SCALE_DOWN:
    auVar9 = divps(local_48,_local_78);
    fVar8 = auVar9._4_4_;
    if (auVar9._0_4_ <= auVar9._4_4_) {
      fVar8 = auVar9._0_4_;
    }
    if (fVar8 < 1.0) {
      local_78._0_4_ = (float)local_78._0_4_ * fVar8;
      local_78._4_4_ = (float)local_78._4_4_ * fVar8;
    }
  case SCALE_NONE:
    local_98.y = (float)local_78._4_4_;
    local_98.x = (float)local_78._0_4_;
    goto LAB_00279c1f;
  case REPEAT:
    auVar9 = divps(local_48,_local_78);
    fVar8 = auVar9._0_4_;
    fVar7 = auVar9._4_4_;
    local_98 = local_48._0_8_;
    break;
  case REPEAT_X:
    local_98.y = (float)local_78._4_4_;
    local_98.x = local_48._0_4_;
    local_78._0_4_ = local_48._0_4_ / (float)local_78._0_4_;
    local_78._4_4_ = 1.0;
    fStack_6c = 0.0;
    goto LAB_00279c26;
  case REPEAT_Y:
    local_98.y = local_58;
    local_98.x = (float)local_78._0_4_;
    local_78._4_4_ = local_58 / (float)local_78._4_4_;
    local_78._0_4_ = 1.0;
    fStack_6c = fStack_54;
LAB_00279c26:
    local_78._8_4_ = 0;
    local_90.x = 0.0;
    local_90.y = 0.0;
    for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 4) {
      TVar3 = (&this->align[0].type)[lVar6 * 2];
      if (TVar3 == Percentage) {
        fVar8 = (*(float *)((long)&local_60.x + lVar6) - *(float *)((long)&local_98.x + lVar6)) *
                *(float *)((long)&this->align[0].value + lVar6 * 2) * 0.01;
LAB_00279c6f:
        *(float *)((long)&local_90.x + lVar6) = fVar8;
      }
      else if (TVar3 == Length) {
        fVar8 = *(float *)((long)&this->align[0].value + lVar6 * 2);
        goto LAB_00279c6f;
      }
    }
    local_90 = Vector2<float>::Round(&local_90);
    for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
      fVar8 = (&local_90.x)[lVar6];
      fVar7 = 0.0;
      if (0.0 <= -fVar8) {
        fVar7 = -fVar8;
      }
      fVar1 = (&local_98.x)[lVar6];
      fVar11 = (fVar8 + fVar1) - (&local_60.x)[lVar6];
      fVar10 = 0.0;
      if (0.0 <= fVar11) {
        fVar10 = fVar11;
      }
      if ((0.0 < fVar7) || (0.0 < fVar10)) {
        fVar11 = *(float *)(local_78 + lVar6 * 4 + -8);
        fVar12 = fVar11 - (&local_88.x)[lVar6];
        (&local_88.x)[lVar6] = (fVar7 / fVar1) * fVar12 + (&local_88.x)[lVar6];
        *(float *)(local_78 + lVar6 * 4 + -8) = fVar11 - (fVar10 / fVar1) * fVar12;
        (&local_98.x)[lVar6] = fVar1 - (fVar7 + fVar10);
        (&local_90.x)[lVar6] = fVar8 + fVar7;
      }
    }
    fVar8 = (float)local_78._0_4_;
    fVar7 = (float)local_78._4_4_;
    goto LAB_00279d50;
  }
  local_90.x = 0.0;
  local_90.y = 0.0;
LAB_00279d50:
  local_88.y = fVar7 * local_88.y;
  local_88.x = fVar8 * local_88.x;
  VStack_80.y = fVar7 * VStack_80.y;
  VStack_80.x = fVar8 * VStack_80.x;
  local_28.y = local_90.y + (float)local_38._4_4_;
  local_28.x = local_90.x + (float)local_38._0_4_;
  Math::SnapToPixelGrid(&local_28,&local_98);
  MeshUtilities::GenerateQuad(mesh,local_28,local_98,colour,local_88,VStack_80);
  return;
}

Assistant:

void DecoratorTiled::Tile::GenerateGeometry(Mesh& mesh, const ComputedValues& computed, const Vector2f surface_origin,
	const Vector2f surface_dimensions, const Vector2f tile_dimensions) const
{
	if (surface_dimensions.x <= 0 || surface_dimensions.y <= 0)
		return;

	const ColourbPremultiplied quad_colour = computed.image_color().ToPremultiplied(computed.opacity());

	if (!tile_data_calculated)
		return;

	// Generate the oriented texture coordinates for the tiles.
	Vector2f scaled_texcoords[2];
	for (int i = 0; i < 2; i++)
	{
		scaled_texcoords[i] = tile_data.texcoords[0] + oriented_texcoords[orientation][i] * (tile_data.texcoords[1] - tile_data.texcoords[0]);
	}

	Vector2f final_tile_dimensions;
	bool offset_and_clip_tile = false;
	Vector2f repeat_factor = Vector2f(1);

	switch (fit_mode)
	{
	case FILL:
	{
		final_tile_dimensions = surface_dimensions;
	}
	break;
	case CONTAIN:
	{
		Vector2f scale_factor = surface_dimensions / tile_dimensions;
		float min_factor = std::min(scale_factor.x, scale_factor.y);
		final_tile_dimensions = tile_dimensions * min_factor;

		offset_and_clip_tile = true;
	}
	break;
	case COVER:
	{
		Vector2f scale_factor = surface_dimensions / tile_dimensions;
		float max_factor = std::max(scale_factor.x, scale_factor.y);
		final_tile_dimensions = tile_dimensions * max_factor;

		offset_and_clip_tile = true;
	}
	break;
	case SCALE_NONE:
	{
		final_tile_dimensions = tile_dimensions;

		offset_and_clip_tile = true;
	}
	break;
	case SCALE_DOWN:
	{
		Vector2f scale_factor = surface_dimensions / tile_dimensions;
		float min_factor = std::min(scale_factor.x, scale_factor.y);
		if (min_factor < 1.0f)
			final_tile_dimensions = tile_dimensions * min_factor;
		else
			final_tile_dimensions = tile_dimensions;

		offset_and_clip_tile = true;
	}
	break;
	case REPEAT:
		final_tile_dimensions = surface_dimensions;
		repeat_factor = surface_dimensions / tile_dimensions;
		break;
	case REPEAT_X:
		final_tile_dimensions = Vector2f(surface_dimensions.x, tile_dimensions.y);
		repeat_factor.x = surface_dimensions.x / tile_dimensions.x;
		offset_and_clip_tile = true;
		break;
	case REPEAT_Y:
		final_tile_dimensions = Vector2f(tile_dimensions.x, surface_dimensions.y);
		repeat_factor.y = surface_dimensions.y / tile_dimensions.y;
		offset_and_clip_tile = true;
		break;
	}

	Vector2f tile_offset(0, 0);

	if (offset_and_clip_tile)
	{
		// Offset tile along each dimension.
		for (int i = 0; i < 2; i++)
		{
			switch (align[i].type)
			{
			case Style::LengthPercentage::Length: tile_offset[i] = align[i].value; break;
			case Style::LengthPercentage::Percentage:
				tile_offset[i] = (surface_dimensions[i] - final_tile_dimensions[i]) * align[i].value * 0.01f;
				break;
			}
		}
		tile_offset = tile_offset.Round();

		// Clip tile. See if our tile extends outside the boundary at either side, along each dimension.
		for (int i = 0; i < 2; i++)
		{
			// Left/right acts as top/bottom during the second iteration.
			float overshoot_left = std::max(-tile_offset[i], 0.0f);
			float overshoot_right = std::max(tile_offset[i] + final_tile_dimensions[i] - surface_dimensions[i], 0.0f);

			if (overshoot_left > 0.f || overshoot_right > 0.f)
			{
				float& left = scaled_texcoords[0][i];
				float& right = scaled_texcoords[1][i];
				float width = right - left;

				left += overshoot_left / final_tile_dimensions[i] * width;
				right -= overshoot_right / final_tile_dimensions[i] * width;

				final_tile_dimensions[i] -= overshoot_left + overshoot_right;
				tile_offset[i] += overshoot_left;
			}
		}
	}

	scaled_texcoords[0] *= repeat_factor;
	scaled_texcoords[1] *= repeat_factor;

	// Generate the vertices for the tiled surface.
	Vector2f tile_position = (surface_origin + tile_offset);
	Math::SnapToPixelGrid(tile_position, final_tile_dimensions);

	MeshUtilities::GenerateQuad(mesh, tile_position, final_tile_dimensions, quad_colour, scaled_texcoords[0], scaled_texcoords[1]);
}